

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_arc.cpp
# Opt level: O3

bool __thiscall ON_Arc::Create(ON_Arc *this,ON_2dPoint *P,ON_2dPoint *Q,ON_2dPoint *R)

{
  bool bVar1;
  double a;
  ON_Circle c;
  double local_c8;
  ON_Interval local_c0;
  ON_3dPoint local_b0;
  ON_Circle local_98;
  
  ON_Circle::ON_Circle(&local_98,P,Q,R);
  local_c8 = 0.0;
  ON_3dPoint::ON_3dPoint(&local_b0,R);
  ON_Circle::ClosestPointTo(&local_98,&local_b0,&local_c8);
  ON_Interval::ON_Interval(&local_c0,0.0,local_c8);
  bVar1 = Create(this,&local_98,local_c0);
  ON_Plane::~ON_Plane(&local_98.plane);
  return bVar1;
}

Assistant:

bool ON_Arc::Create( // arc through 3 2d points
  const ON_2dPoint& P, // point P
  const ON_2dPoint& Q, // point Q
  const ON_2dPoint& R // point R
  )
{
  ON_Circle c(P,Q,R);
  double a = 0.0;
  c.ClosestPointTo( ON_3dPoint(R), &a );
  return Create( c, ON_Interval(0.0,a) );
}